

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void aead_do_encrypt_init(ptls_aead_context_t *_ctx,uint64_t seq,void *aad,size_t aadlen)

{
  int iVar1;
  int blocklen;
  uint8_t iv [16];
  int local_3c;
  uint8_t local_38 [24];
  
  ptls_aead__build_iv(_ctx->algo,local_38,(uint8_t *)&_ctx[1].dispose_crypto,seq);
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,local_38);
  if (iVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,900,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, uint64_t, const void *, size_t)"
                 );
  }
  if (aadlen != 0) {
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)0x0,&local_3c,(uchar *)aad,
                              (int)aadlen);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x389,
                    "void aead_do_encrypt_init(ptls_aead_context_t *, uint64_t, const void *, size_t)"
                   );
    }
  }
  return;
}

Assistant:

static void aead_do_encrypt_init(ptls_aead_context_t *_ctx, uint64_t seq, const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t iv[PTLS_MAX_IV_SIZE];
    int ret;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);

    if (aadlen != 0) {
        int blocklen;
        ret = EVP_EncryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
}